

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall
cmTestGenerator::GenerateScriptActions(cmTestGenerator *this,ostream *os,Indent indent)

{
  char cVar1;
  cmTest *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  ostream *poVar5;
  char *__s;
  _Base_ptr p_Var6;
  pointer pbVar7;
  size_type sVar8;
  allocator<char> aStack_ad;
  cmScriptGeneratorIndent cStack_ac;
  cmTestGenerator *pcStack_a8;
  string sStack_a0;
  pointer pbStack_80;
  pointer pbStack_78;
  string sStack_70;
  string sStack_50;
  
  if ((this->super_cmScriptGenerator).ActionsPerConfig == true) {
    cmScriptGenerator::GenerateScriptActions(&this->super_cmScriptGenerator,os,indent);
    return;
  }
  this->TestGenerated = true;
  pcVar2 = this->Test;
  cStack_ac.Level = indent.Level;
  pcStack_a8 = this;
  std::__cxx11::string::string
            ((string *)&sStack_70,
             (string *)
             (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  cmsys::SystemTools::ConvertToUnixSlashes(&sStack_70);
  operator<<(os,cStack_ac);
  std::operator<<(os,"add_test(");
  std::__cxx11::string::string((string *)&sStack_a0,(string *)&pcStack_a8->Test->Name);
  poVar5 = std::operator<<(os,(string *)&sStack_a0);
  poVar5 = std::operator<<(poVar5," \"");
  poVar5 = std::operator<<(poVar5,(string *)&sStack_70);
  std::operator<<(poVar5,"\"");
  std::__cxx11::string::~string((string *)&sStack_a0);
  pbStack_80 = (pcVar2->Command).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  pbVar7 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar7 + 1 != pbStack_80) {
    pbStack_78 = pbVar7 + 1;
    std::operator<<(os," \"");
    pcVar3 = pbVar7[1]._M_dataplus._M_p;
    sVar4 = pbVar7[1]._M_string_length;
    for (sVar8 = 0; sVar4 != sVar8; sVar8 = sVar8 + 1) {
      cVar1 = pcVar3[sVar8];
      if (cVar1 == '\"') {
        std::operator<<(os,'\\');
      }
      std::operator<<(os,cVar1);
    }
    std::operator<<(os,"\"");
    pbVar7 = pbStack_78;
  }
  poVar5 = std::operator<<(os,")");
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar2 = pcStack_a8->Test;
  poVar5 = operator<<(os,cStack_ac);
  poVar5 = std::operator<<(poVar5,"set_tests_properties(");
  std::__cxx11::string::string((string *)&sStack_a0,(string *)&pcStack_a8->Test->Name);
  poVar5 = std::operator<<(poVar5,(string *)&sStack_a0);
  std::operator<<(poVar5," PROPERTIES ");
  std::__cxx11::string::~string((string *)&sStack_a0);
  for (p_Var6 = (pcVar2->Properties).
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 !=
      &(pcVar2->Properties).
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::operator<<(os," ");
    poVar5 = std::operator<<(poVar5,(string *)(p_Var6 + 1));
    poVar5 = std::operator<<(poVar5," ");
    __s = cmProperty::GetValue((cmProperty *)(p_Var6 + 2));
    std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_50,__s,&aStack_ad);
    cmOutputConverter::EscapeForCMake(&sStack_a0,&sStack_50);
    std::operator<<(poVar5,(string *)&sStack_a0);
    std::__cxx11::string::~string((string *)&sStack_a0);
    std::__cxx11::string::~string((string *)&sStack_50);
  }
  GenerateInternalProperties(pcStack_a8,os);
  poVar5 = std::operator<<(os,")");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&sStack_70);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptActions(std::ostream& os, Indent indent)
{
  if (this->ActionsPerConfig) {
    // This is the per-config generation in a single-configuration
    // build generator case.  The superclass will call our per-config
    // method.
    this->cmScriptGenerator::GenerateScriptActions(os, indent);
  } else {
    // This is an old-style test, so there is only one config.
    // assert(this->Test->GetOldStyle());
    this->GenerateOldStyle(os, indent);
  }
}